

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::ConvertToHalfPass::ProcessImageRef(ConvertToHalfPass *this,Instruction *inst)

{
  pointer pOVar1;
  IRContext *this_00;
  size_type sVar2;
  size_type sVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  uint32_t dref_id;
  array<signed_char,_4UL> local_54;
  undefined1 local_50 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_30;
  
  local_50._0_4_ = inst->opcode_;
  sVar2 = std::
          _Hashtable<spv::Op,_spv::Op,_std::allocator<spv::Op>,_std::__detail::_Identity,_std::equal_to<spv::Op>,_spvtools::opt::ConvertToHalfPass::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&(this->dref_image_ops_)._M_h,(key_type *)local_50);
  if (sVar2 == 0) {
    bVar7 = false;
  }
  else {
    uVar5 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar5 = (uint)inst->has_result_id_;
    }
    local_54._M_elems = (_Type)Instruction::GetSingleWordOperand(inst,uVar5 + 2);
    sVar3 = std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->converted_ids_)._M_h,(key_type_conflict *)&local_54);
    bVar7 = sVar3 != 0;
    if (bVar7) {
      GenConvert(this,(uint32_t *)&local_54,0x20,inst);
      local_50._24_8_ = local_50 + 0x10;
      local_50._0_8_ = &PTR__SmallVector_00b15d78;
      local_30._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_50[0x10] = local_54._M_elems[0];
      local_50[0x11] = local_54._M_elems[1];
      local_50[0x12] = local_54._M_elems[2];
      local_50[0x13] = local_54._M_elems[3];
      local_50._8_8_ = 1;
      uVar4 = (ulong)(inst->has_result_id_ & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar4 = (ulong)inst->has_result_id_;
      }
      uVar4 = uVar4 + 2;
      pOVar1 = (inst->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar6 = ((long)(inst->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar1 >> 4) *
              -0x5555555555555555;
      if (uVar6 < uVar4 || uVar6 - uVar4 == 0) {
        __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2b8,
                      "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                     );
      }
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)
                 ((long)((pOVar1->words).buffer + 0xfffffffffffffffc) +
                 (ulong)(uint)((int)uVar4 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_50);
      local_50._0_8_ = &PTR__SmallVector_00b15d78;
      if (local_30._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_30,local_30._M_head_impl);
      }
      this_00 = (this->super_Pass).context_;
      if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(this_00);
      }
      analysis::DefUseManager::AnalyzeInstUse
                ((this_00->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,inst);
    }
  }
  return bVar7;
}

Assistant:

bool ConvertToHalfPass::ProcessImageRef(Instruction* inst) {
  bool modified = false;
  // If image reference, only need to convert dref args back to float32
  if (dref_image_ops_.count(inst->opcode()) != 0) {
    uint32_t dref_id = inst->GetSingleWordInOperand(kImageSampleDrefIdInIdx);
    if (converted_ids_.count(dref_id) > 0) {
      GenConvert(&dref_id, 32, inst);
      inst->SetInOperand(kImageSampleDrefIdInIdx, {dref_id});
      get_def_use_mgr()->AnalyzeInstUse(inst);
      modified = true;
    }
  }
  return modified;
}